

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeGlobals(WasmBinaryWriter *this)

{
  Type *this_00;
  pointer puVar1;
  Global *pGVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  Index IVar4;
  size_t sVar5;
  Type *pTVar6;
  Expression **ppEVar7;
  pointer puVar8;
  Expression *curr;
  size_t index;
  U32LEB UVar9;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  Iterator local_48;
  int32_t local_34;
  
  IVar4 = ImportInfo::getNumDefinedGlobals
                    ((this->importInfo)._M_t.
                     super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>
                     .super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl);
  if (IVar4 != 0) {
    local_34 = startSection<wasm::BinaryConsts::Section>(this,Global);
    puVar1 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    UVar9.value = 0;
    for (puVar8 = (this->wasm->globals).
                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      pGVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        sVar5 = wasm::Type::size(&pGVar2->type);
        UVar9.value = UVar9.value + (int)sVar5;
      }
    }
    BufferWithRandomAccess::operator<<(this->o,UVar9);
    puVar1 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->wasm->globals).
                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      pGVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        this_00 = &pGVar2->type;
        local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
        local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             this_00;
        PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end(this_00);
        index = 0;
        sVar5 = 0;
        pTVar6 = this_00;
        while (PVar3.index = sVar5, PVar3.parent = pTVar6, PVar10 != PVar3) {
          pTVar6 = wasm::Type::Iterator::operator*(&local_48);
          writeType(this,(Type)pTVar6->id);
          UVar9.value._1_3_ = 0;
          UVar9.value._0_1_ = pGVar2->mutable_;
          BufferWithRandomAccess::operator<<(this->o,UVar9);
          sVar5 = wasm::Type::size(this_00);
          curr = pGVar2->init;
          if (sVar5 != 1) {
            if (curr->_id != TupleMakeId) {
              handle_unreachable("unsupported tuple global operation",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                                 ,0x252);
            }
            ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)(curr + 1),index);
            curr = *ppEVar7;
          }
          writeExpression(this,curr);
          BufferWithRandomAccess::operator<<(this->o,'\v');
          index = index + 1;
          sVar5 = local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  + 1;
          pTVar6 = local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent;
          local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar5
          ;
        }
      }
    }
    finishSection(this,local_34);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeGlobals() {
  if (importInfo->getNumDefinedGlobals() == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Global);
  // Count and emit the total number of globals after tuple globals have been
  // expanded into their constituent parts.
  Index num = 0;
  ModuleUtils::iterDefinedGlobals(
    *wasm, [&num](Global* global) { num += global->type.size(); });
  o << U32LEB(num);
  ModuleUtils::iterDefinedGlobals(*wasm, [&](Global* global) {
    size_t i = 0;
    for (const auto& t : global->type) {
      writeType(t);
      o << U32LEB(global->mutable_);
      if (global->type.size() == 1) {
        writeExpression(global->init);
      } else if (auto* make = global->init->dynCast<TupleMake>()) {
        // Emit the proper lane for this global.
        writeExpression(make->operands[i]);
      } else {
        // For now tuple globals must contain tuple.make. We could perhaps
        // support more operations, like global.get, but the code would need to
        // look something like this:
        //
        //   auto parentIndex = getGlobalIndex(get->name);
        //   o << int8_t(BinaryConsts::GlobalGet) << U32LEB(parentIndex + i);
        //
        // That is, we must emit the instruction here, and not defer to
        // writeExpression, as writeExpression writes an entire expression at a
        // time (and not just one of the lanes). As emitting an instruction here
        // is less clean, and there is no important use case for global.get of
        // one tuple global to another, we disallow this.
        WASM_UNREACHABLE("unsupported tuple global operation");
      }
      o << int8_t(BinaryConsts::End);
      ++i;
    }
  });
  finishSection(start);
}